

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

bool Internal_NotEqualFloatArray(size_t count,float *lhs,float *rhs)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  
  pfVar1 = lhs + count;
  bVar4 = false;
  do {
    while( true ) {
      if (pfVar1 <= lhs) {
        return bVar4;
      }
      fVar2 = *lhs;
      fVar3 = *rhs;
      lhs = lhs + 1;
      if ((fVar2 == fVar3) && (!NAN(fVar2) && !NAN(fVar3))) break;
      bVar4 = true;
      rhs = rhs + 1;
    }
    rhs = rhs + 1;
  } while (!NAN(fVar2) && !NAN(fVar3));
  return false;
}

Assistant:

static bool Internal_NotEqualFloatArray(size_t count, const float* lhs, const float* rhs)
{
  bool rc = false;
  const float* e = lhs + count; 
  while (lhs < e)
  {
    const float x = *lhs++;
    const float y = *rhs++;
    if (x != y)
    {
      // neither x nor y is a nan
      rc = true;
      continue;
    }
    if (!(x == x))
      return false; // nan
    if (!(y == y))
      return false; // nan
  }
  return rc;
}